

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result __thiscall wabt::anon_unknown_14::NameResolver::BeginIfExpr(NameResolver *this,IfExpr *expr)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->true_).label);
  ResolveBlockDeclarationVar(this,&(expr->true_).decl);
  return (Result)Ok;
}

Assistant:

Result NameResolver::BeginIfExpr(IfExpr* expr) {
  PushLabel(expr->true_.label);
  ResolveBlockDeclarationVar(&expr->true_.decl);
  return Result::Ok;
}